

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O3

golomb_code_table *
charls::anon_unknown_82::initialize_table(golomb_code_table *__return_storage_ptr__,int32_t k)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  golomb_code_table *pgVar4;
  int iVar5;
  golomb_code c;
  short sVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  
  bVar1 = (byte)k;
  uVar3 = 0;
  pgVar4 = (golomb_code_table *)memset(__return_storage_ptr__,0,0x800);
  uVar7 = k + 1;
  bVar2 = (byte)(1 << (bVar1 & 0x1f));
  if (uVar7 < 9) {
    sVar6 = 1;
    pgVar4 = (golomb_code_table *)0x0;
    uVar8 = uVar7;
    do {
      golomb_code_table::add_entry
                (__return_storage_ptr__,(byte)uVar3 & bVar2 - 1 | bVar2,
                 (golomb_code)((ulong)pgVar4 | (ulong)uVar8 << 0x20));
      uVar3 = (uint)sVar6;
      pgVar4 = (golomb_code_table *)(ulong)uVar3;
      uVar3 = uVar3 * 2 ^ (int)uVar3 >> 0x1e;
      uVar8 = ((int)uVar3 >> (bVar1 & 0x1f)) + uVar7;
      sVar6 = sVar6 + 1;
    } while (uVar8 < 9);
  }
  uVar9 = (1U >> (bVar1 & 0x1f)) + uVar7;
  if (uVar9 < 9) {
    iVar5 = -1;
    pgVar4 = (golomb_code_table *)0x1;
    sVar6 = -2;
    do {
      c.length_ = uVar9;
      c.value_ = iVar5;
      golomb_code_table::add_entry(__return_storage_ptr__,(byte)pgVar4 & bVar2 - 1 | bVar2,c);
      iVar5 = (int)sVar6;
      uVar3 = iVar5 * 2 ^ iVar5 >> 0x1e;
      pgVar4 = (golomb_code_table *)(ulong)uVar3;
      uVar9 = ((int)uVar3 >> (bVar1 & 0x1f)) + uVar7;
      sVar6 = sVar6 + -1;
    } while (uVar9 < 9);
  }
  return pgVar4;
}

Assistant:

golomb_code_table initialize_table(const int32_t k) noexcept
{
    golomb_code_table table;
    for (int16_t error_value{};; ++error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const golomb_code code(error_value, conditional_static_cast<int16_t>(pair_code.first));
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    for (int16_t error_value{-1};; --error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const auto code{golomb_code(error_value, static_cast<int16_t>(pair_code.first))};
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    return table;
}